

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall Minisat::MarkArray::~MarkArray(MarkArray *this)

{
  pointer puVar1;
  
  puVar1 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    this->step = 0;
  }
  else {
    operator_delete(puVar1);
    puVar1 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->step = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      return;
    }
  }
  return;
}

Assistant:

void destroy()
    {
        std::vector<uint32_t>().swap(array);
        step = 0;
    }